

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

double google::protobuf::internal::NoLocaleStrtod(char *str,char **endptr)

{
  undefined8 uVar1;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  string localized;
  char *localized_endptr;
  char *temp_endptr;
  LogFinisher local_89;
  double local_88;
  LogMessage local_80;
  undefined8 local_48;
  char *local_38;
  
  local_88 = strtod(str,&local_38);
  if (endptr != (char **)0x0) {
    *endptr = local_38;
  }
  if (*local_38 == '.') {
    iVar2 = snprintf((char *)&local_48,0x10,"%.1f",0x3ff8000000000000);
    if ((char)local_48 != '1') {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x97b);
      pLVar3 = LogMessage::operator<<(&local_80,"CHECK failed: (temp[0]) == (\'1\'): ");
      LogFinisher::operator=(&local_89,pLVar3);
      LogMessage::~LogMessage(&local_80);
    }
    if (*(char *)((long)&local_48 + (long)iVar2 + -1) != '5') {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x97c);
      pLVar3 = LogMessage::operator<<(&local_80,"CHECK failed: (temp[size - 1]) == (\'5\'): ");
      LogFinisher::operator=(&local_89,pLVar3);
      LogMessage::~LogMessage(&local_80);
    }
    if (6 < iVar2) {
      LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x97d);
      pLVar3 = LogMessage::operator<<(&local_80,"CHECK failed: (size) <= (6): ");
      LogFinisher::operator=(&local_89,pLVar3);
      LogMessage::~LogMessage(&local_80);
    }
    local_80._0_8_ = (long)&local_80 + 0x10;
    local_80.filename_ = (char *)0x0;
    local_80.line_._0_1_ = '\0';
    strlen(str);
    std::__cxx11::string::reserve((ulong)&local_80);
    std::__cxx11::string::replace((ulong)&local_80,(ulong)local_80.filename_,(char *)0x0,(ulong)str)
    ;
    std::__cxx11::string::append((char *)&local_80,(long)&local_48 + 1);
    std::__cxx11::string::append((char *)&local_80);
    uVar1 = local_80._0_8_;
    local_88 = strtod((char *)local_80._0_8_,(char **)&local_48);
    if ((endptr != (char **)0x0) &&
       ((long)local_38 - (long)str < CONCAT71(local_48._1_7_,(char)local_48) - uVar1)) {
      iVar2 = (int)local_80.filename_;
      sVar4 = strlen(str);
      *endptr = str + (CONCAT71(local_48._1_7_,(char)local_48) -
                      (long)(uVar1 + (long)(iVar2 - (int)sVar4)));
    }
    if ((char *)local_80._0_8_ != (char *)((long)&local_80 + 0x10U)) {
      operator_delete((void *)local_80._0_8_);
    }
  }
  return local_88;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  // We cannot simply set the locale to "C" temporarily with setlocale()
  // as this is not thread-safe.  Instead, we try to parse in the current
  // locale first.  If parsing stops at a '.' character, then this is a
  // pretty good hint that we're actually in some other locale in which
  // '.' is not the radix character.

  char *temp_endptr;
  double result = strtod(str, &temp_endptr);
  if (endptr != NULL) *endptr = temp_endptr;
  if (*temp_endptr != '.') return result;

  // Parsing halted on a '.'.  Perhaps we're in a different locale?  Let's
  // try to replace the '.' with a locale-specific radix character and
  // try again.
  std::string localized = LocalizeRadix(str, temp_endptr);
  const char *localized_cstr = localized.c_str();
  char *localized_endptr;
  result = strtod(localized_cstr, &localized_endptr);
  if ((localized_endptr - localized_cstr) > (temp_endptr - str)) {
    // This attempt got further, so replacing the decimal must have helped.
    // Update endptr to point at the right location.
    if (endptr != NULL) {
      // size_diff is non-zero if the localized radix has multiple bytes.
      int size_diff = localized.size() - strlen(str);
      // const_cast is necessary to match the strtod() interface.
      *endptr = const_cast<char *>(
          str + (localized_endptr - localized_cstr - size_diff));
    }
  }

  return result;
}